

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::TruncateStdoutStderr(void)

{
  uint32 uVar1;
  uint64 keep;
  uint64 limit;
  
  uVar1 = MaxLogSize();
  TruncateLogFile("/proc/self/fd/1",(ulong)(uVar1 << 0x14),0x100000);
  TruncateLogFile("/proc/self/fd/2",(ulong)(uVar1 << 0x14),0x100000);
  return;
}

Assistant:

void TruncateStdoutStderr() {
#ifdef HAVE_UNISTD_H
  uint64 limit = MaxLogSize() << 20U;
  uint64 keep = 1U << 20U;
  TruncateLogFile("/proc/self/fd/1", limit, keep);
  TruncateLogFile("/proc/self/fd/2", limit, keep);
#else
  LOG(ERROR) << "No log truncation support.";
#endif
}